

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask6_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 6 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 0xc | uVar1;
  *out = uVar1;
  uVar1 = in[3] << 0x12 | uVar1;
  *out = uVar1;
  uVar1 = in[4] << 0x18 | uVar1;
  *out = uVar1;
  uVar2 = in[5];
  *out = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[1] = uVar2;
  uVar2 = in[6] << 4 | uVar2;
  out[1] = uVar2;
  uVar2 = in[7] << 10 | uVar2;
  out[1] = uVar2;
  uVar2 = in[8] << 0x10 | uVar2;
  out[1] = uVar2;
  uVar2 = in[9] << 0x16 | uVar2;
  out[1] = uVar2;
  uVar1 = in[10];
  out[1] = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[2] = uVar1;
  uVar1 = in[0xb] << 2 | uVar1;
  out[2] = uVar1;
  uVar1 = in[0xc] << 8 | uVar1;
  out[2] = uVar1;
  uVar1 = in[0xd] << 0xe | uVar1;
  out[2] = uVar1;
  uVar1 = in[0xe] << 0x14 | uVar1;
  out[2] = uVar1;
  out[2] = in[0xf] << 0x1a | uVar1;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask6_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (6 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (6 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  ++in;

  return out;
}